

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_lpf1_init_preallocated(ma_lpf1_config *pConfig,void *pHeap,ma_lpf1 *pLPF)

{
  void *in_RDX;
  void *in_RSI;
  ma_lpf1_heap_layout heapLayout;
  ma_result result;
  ma_lpf1 *in_stack_ffffffffffffffa8;
  ma_lpf1_config *in_stack_ffffffffffffffb0;
  ma_result local_24;
  
  if (in_RDX == (void *)0x0) {
    local_24 = MA_INVALID_ARGS;
  }
  else {
    if (in_RDX != (void *)0x0) {
      memset(in_RDX,0,0x28);
    }
    local_24 = ma_lpf1_get_heap_layout
                         ((ma_lpf1_config *)in_stack_ffffffffffffffa8,
                          (ma_lpf1_heap_layout *)0x1bdd6b);
    if (local_24 == MA_SUCCESS) {
      *(void **)((long)in_RDX + 0x18) = in_RSI;
      if ((in_RSI != (void *)0x0) && (in_stack_ffffffffffffffa8 != (ma_lpf1 *)0x0)) {
        memset(in_RSI,0,(size_t)in_stack_ffffffffffffffa8);
      }
      *(long *)((long)in_RDX + 0x10) = (long)in_RSI + (long)in_stack_ffffffffffffffb0;
      local_24 = ma_lpf1_reinit(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
  }
  return local_24;
}

Assistant:

MA_API ma_result ma_lpf1_init_preallocated(const ma_lpf1_config* pConfig, void* pHeap, ma_lpf1* pLPF)
{
    ma_result result;
    ma_lpf1_heap_layout heapLayout;

    if (pLPF == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pLPF);

    result = ma_lpf1_get_heap_layout(pConfig, &heapLayout);
    if (result != MA_SUCCESS) {
        return result;
    }

    pLPF->_pHeap = pHeap;
    MA_ZERO_MEMORY(pHeap, heapLayout.sizeInBytes);

    pLPF->pR1 = (ma_biquad_coefficient*)ma_offset_ptr(pHeap, heapLayout.r1Offset);

    return ma_lpf1_reinit(pConfig, pLPF);
}